

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

void GD::end_pass(gd *g)

{
  long *plVar1;
  bool bVar2;
  long in_RDI;
  size_t in_stack_00000010;
  string *in_stack_00000018;
  vw *in_stack_00000020;
  vw *all;
  size_t *in_stack_fffffffffffffe50;
  vw *in_stack_fffffffffffffe58;
  typed_option<double> *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe78;
  string *key;
  options_i *in_stack_fffffffffffffe80;
  allocator *this;
  parameters *in_stack_fffffffffffffea8;
  vw *in_stack_fffffffffffffeb0;
  string local_140 [16];
  vw *in_stack_fffffffffffffed0;
  parameters *in_stack_fffffffffffffed8;
  vw *in_stack_fffffffffffffee0;
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [32];
  string *in_stack_ffffffffffffff48;
  vw *in_stack_ffffffffffffff50;
  undefined1 local_89 [33];
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  long *local_10;
  long local_8;
  
  local_10 = *(long **)(in_RDI + 0x60);
  local_8 = in_RDI;
  if ((*(byte *)((long)local_10 + 0x9e) & 1) == 0) {
    sync_weights(in_stack_fffffffffffffed0);
  }
  else {
    if ((*(double *)(*local_10 + 0x58) != 0.0) || (NAN(*(double *)(*local_10 + 0x58)))) {
      in_stack_fffffffffffffeb0 = *(vw **)(*(long *)(in_RDI + 0x60) + 0x278);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_30,"l1_state",&local_31);
      std::__cxx11::to_string((double)in_stack_fffffffffffffe58);
      (*(code *)in_stack_fffffffffffffeb0->sd->weighted_unlabeled_examples)
                (in_stack_fffffffffffffeb0,local_30,local_68);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      in_stack_fffffffffffffea8 = (parameters *)local_89;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_89 + 1),"l1_state",(allocator *)in_stack_fffffffffffffea8);
      VW::config::options_i::get_typed_option<double>
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      VW::config::typed_option<double>::value
                (in_stack_fffffffffffffe60,(double)in_stack_fffffffffffffe58);
      std::__cxx11::string::~string((string *)(local_89 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_89);
    }
    if ((*(double *)(*local_10 + 0x60) != 1.0) || (NAN(*(double *)(*local_10 + 0x60)))) {
      plVar1 = *(long **)(*(long *)(local_8 + 0x60) + 0x278);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff50,"l2_state",(allocator *)&stack0xffffffffffffff4f
                );
      std::__cxx11::to_string((double)in_stack_fffffffffffffe58);
      (**(code **)(*plVar1 + 0x30))(plVar1,&stack0xffffffffffffff50,local_d8);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
      key = *(string **)(*(long *)(local_8 + 0x60) + 0x278);
      this = &local_f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"l2_state",this);
      VW::config::options_i::get_typed_option<double>((options_i *)this,key);
      VW::config::typed_option<double>::value
                (in_stack_fffffffffffffe60,(double)in_stack_fffffffffffffe58);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    }
  }
  if (local_10[4] != 0) {
    if ((*(byte *)((long)local_10 + 0x343c) & 1) == 0) {
      accumulate_avg(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                     (size_t)in_stack_fffffffffffffed0);
    }
    else {
      accumulate_weighted_avg(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    }
  }
  *(float *)(local_10 + 0x6ac) = *(float *)((long)local_10 + 0x3564) * *(float *)(local_10 + 0x6ac);
  if ((*(byte *)(local_10 + 0x12) & 1) != 0) {
    std::__cxx11::string::string((string *)&stack0xfffffffffffffee0,(string *)(local_10 + 0x6ae));
    save_predictor(in_stack_00000020,in_stack_00000018,in_stack_00000010);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
  }
  if ((*(byte *)((long)local_10 + 0x3457) & 1) == 0) {
    bVar2 = summarize_holdout_set(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    if (bVar2) {
      std::__cxx11::string::string(local_140,(string *)(local_10 + 0x6ae));
      finalize_regressor(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::__cxx11::string::~string(local_140);
    }
    if ((*(long *)(local_8 + 0x10) == *(long *)(local_8 + 8)) &&
       (((ulong)local_10[0x68d] < 2 || ((ulong)local_10[9] % (ulong)local_10[0x68d] == 0)))) {
      set_done((vw *)0x160dbf);
    }
  }
  return;
}

Assistant:

void end_pass(gd& g)
{
  vw& all = *g.all;
  if (all.save_resume)
  {
    // TODO work out a better system to update state that will be saved in the model.
    if (all.sd->gravity != 0.)
    {
      g.all->options->replace("l1_state", std::to_string(all.sd->gravity));
      g.all->options->get_typed_option<double>("l1_state").value(all.sd->gravity);
    }
    if (all.sd->contraction != 1.)
    {
      g.all->options->replace("l2_state", std::to_string(all.sd->contraction));
      g.all->options->get_typed_option<double>("l2_state").value(all.sd->contraction);
    }
  }
  else
    sync_weights(all);
  if (all.all_reduce != nullptr)
  {
    if (all.adaptive)
      accumulate_weighted_avg(all, all.weights);
    else
      accumulate_avg(all, all.weights, 0);
  }
  all.eta *= all.eta_decay_rate;
  if (all.save_per_pass)
    save_predictor(all, all.final_regressor_name, all.current_pass);

  if (!all.holdout_set_off)
  {
    if (summarize_holdout_set(all, g.no_win_counter))
      finalize_regressor(all, all.final_regressor_name);
    if ((g.early_stop_thres == g.no_win_counter) &&
        ((all.check_holdout_every_n_passes <= 1) || ((all.current_pass % all.check_holdout_every_n_passes) == 0)))
      set_done(all);
  }
}